

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstr.c
# Opt level: O1

uint8_t * bstr_parse_json_string_literal
                    (bstr_context_t *ctx,uint8_t *pBegin,uint8_t *pEnd,adt_str_t *str)

{
  adt_error_t aVar1;
  int *piVar2;
  ulong uVar3;
  ulong uVar4;
  uint c;
  uint c_00;
  byte bVar5;
  bool bVar6;
  byte *pbVar7;
  byte bVar8;
  byte bVar9;
  bool bVar10;
  bool bVar11;
  byte *local_50;
  
  if ((((pEnd < pBegin) || (ctx == (bstr_context_t *)0x0)) || (pBegin == (uint8_t *)0x0)) ||
     ((pEnd == (uint8_t *)0x0 || (str == (adt_str_t *)0x0)))) {
    piVar2 = __errno_location();
    *piVar2 = 0x16;
    pBegin = (uint8_t *)0x0;
  }
  else if (pBegin < pEnd) {
    if (*pBegin == '\"') {
      pbVar7 = pBegin + 1;
      bVar6 = false;
      bVar9 = 0;
      bVar5 = 0;
      c_00 = 0;
      do {
        bVar10 = pEnd <= pbVar7;
        if (bVar10) break;
        bVar8 = *pbVar7;
        pbVar7 = pbVar7 + 1;
        c = (uint)bVar8;
        if (bVar6) {
          if (bVar9 == 0x75) {
            if (bVar5 < 4) {
              c_00 = c_00 << 4 | ASCIIHexToInt[bVar8];
              bVar5 = bVar5 + 1;
            }
            bVar8 = bVar9;
            if (bVar5 == 4) {
              adt_str_push(str,c_00);
              bVar5 = 0;
              c_00 = 0;
              bVar8 = 0;
            }
          }
          else {
            if (c == 0x22) {
              bVar11 = true;
              uVar3 = 0;
            }
            else {
              if (c == 0x75) goto LAB_0013af5c;
              uVar3 = 0;
              do {
                uVar4 = uVar3;
                bVar11 = uVar4 < 7;
                if (uVar4 == 7) {
                  ctx->lastError = 4;
                  local_50 = (byte *)0x0;
                  goto LAB_0013af52;
                }
                uVar3 = uVar4 + 1;
              } while (bVar8 != (&DAT_00148831)[uVar4]);
              bVar11 = uVar4 < 7;
            }
            adt_str_push(str,(uint)(byte)(&DAT_00148838)[uVar3]);
            bVar6 = false;
LAB_0013af52:
            bVar8 = bVar9;
            if (!bVar11) {
              bVar11 = false;
              goto LAB_0013af5e;
            }
          }
LAB_0013af5c:
          bVar11 = true;
          bVar9 = bVar8;
        }
        else if (bVar8 == 0x22) {
          bVar11 = false;
          local_50 = pbVar7;
        }
        else {
          if (bVar8 == 0x5c) {
            bVar6 = true;
            bVar8 = bVar9;
            goto LAB_0013af5c;
          }
          if (bVar8 < 0x20) {
            ctx->lastError = 4;
            bVar11 = false;
            local_50 = (byte *)0x0;
          }
          else {
            aVar1 = adt_str_push(str,c);
            bVar8 = bVar9;
            if (aVar1 == '\0') goto LAB_0013af5c;
            ctx->lastError = 5;
            local_50 = (byte *)0x0;
            bVar11 = false;
          }
        }
LAB_0013af5e:
      } while (bVar11);
    }
    else {
      bVar10 = true;
    }
    if (!bVar10) {
      return local_50;
    }
  }
  return pBegin;
}

Assistant:

const uint8_t *bstr_parse_json_string_literal(bstr_context_t *ctx, const uint8_t *pBegin, const uint8_t *pEnd, adt_str_t *str)
{
#define NUM_ESCAPE_CHARS 8
   const uint8_t quotationMark = '"';
   const uint8_t backslash = '\\';
   const uint8_t frontslash = '/';
   const uint8_t backspace = '\b';
   const uint8_t formfeed = '\f';
   const uint8_t linefeed = '\n';
   const uint8_t carriageReturn = '\r';
   const uint8_t horizontalTab = '\t';
   const uint8_t validEscapeChars[NUM_ESCAPE_CHARS] = {
         quotationMark,
         backslash,
         frontslash,
         'b',
         'f',
         'n',
         'r',
         't'
   };
   const uint8_t escapeCharMap[NUM_ESCAPE_CHARS] = {
         quotationMark,
         backslash,
         frontslash,
         backspace,
         formfeed,
         linefeed,
         carriageReturn,
         horizontalTab,
   };

   if ( (ctx == 0) || (pBegin == 0) || (pEnd == 0) || (str == 0) || (pEnd < pBegin) )
   {
      errno = EINVAL;
      return (const uint8_t*) 0;
   }
   if (pBegin < pEnd)
   {
      uint8_t firstChar = *pBegin;
      if (firstChar == quotationMark)
      {
         const uint8_t *pNext = pBegin+1;
         bool isEscapeSequence = false;
         uint8_t escapeType = 0u;
         uint8_t numDigits = 0u;
         uint32_t value = 0u;
         while(pNext < pEnd)
         {
            uint8_t c = *pNext++;
            if (isEscapeSequence)
            {
               if (escapeType == 'u')
               {
                  if (numDigits<4)
                  {
                     value<<=4;
                     value|=ASCIIHexToInt[c];
                     numDigits++;
                  }
                  if (numDigits==4)
                  {
                     //TODO: adt_str_push does not yet support unicode, will need to fix that.
                     //TODO: JSON can contain two \u sequences in a row to allow large code points. Will implement that later.
                     adt_str_push(str, (int) value);
                     escapeType = 0u;
                     numDigits = 0u;
                     value = 0u;
                  }
               }
               else
               {
                  if (c == 'u')
                  {
                     escapeType = c;
                  }
                  else
                  {
                     int32_t i;
                     for (i=0; i<NUM_ESCAPE_CHARS; i++)
                     {
                        if (c==validEscapeChars[i])
                        {
                           break;
                        }
                     }
                     if (i < NUM_ESCAPE_CHARS)
                     {
                        adt_str_push(str, escapeCharMap[i]);
                        isEscapeSequence = false;
                     }
                     else
                     {
                        bstr_set_error(ctx, BSTR_INVALID_CHARACTER_ERROR);
                        return (const uint8_t*) 0;
                     }
                  }
               }
            }
            else
            {
               if (c == quotationMark)
               {
                  return pNext;
               }
               else if (c == backslash)
               {
                  isEscapeSequence = true;
               }
               else if (bstr_pred_is_control_char(c))
               {
                  bstr_set_error(ctx, BSTR_INVALID_CHARACTER_ERROR);
                  return (const uint8_t*) 0;
               }
               else
               {
                  adt_error_t result = adt_str_push(str, c);
                  if (result != ADT_NO_ERROR)
                  {
                     bstr_set_error(ctx, BSTR_MEM_ERROR);
                     return (const uint8_t*) 0;
                  }
               }
            }
         }
      }
   }
   return pBegin;
#undef NUM_ESCAPE_CHARS
}